

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

curl_hash_element * Curl_hash_next_element(curl_hash_iterator *iter)

{
  long lVar1;
  int iVar2;
  curl_llist_element *pcVar3;
  
  if (iter->current_element != (curl_llist_element *)0x0) {
    pcVar3 = iter->current_element->next;
    iter->current_element = pcVar3;
    if (pcVar3 != (curl_llist_element *)0x0) goto LAB_0011fd8b;
  }
  iVar2 = iter->slot_index;
  lVar1 = (long)iVar2;
  while( true ) {
    iVar2 = iVar2 + 1;
    if (iter->hash->slots <= lVar1) {
      iter->current_element = (curl_llist_element *)0x0;
      return (curl_hash_element *)0x0;
    }
    pcVar3 = iter->hash->table[lVar1]->head;
    if (pcVar3 != (curl_llist_element *)0x0) break;
    lVar1 = lVar1 + 1;
  }
  iter->current_element = pcVar3;
  iter->slot_index = iVar2;
LAB_0011fd8b:
  return (curl_hash_element *)pcVar3->ptr;
}

Assistant:

struct curl_hash_element *
Curl_hash_next_element(struct curl_hash_iterator *iter)
{
  int i;
  struct curl_hash *h = iter->hash;

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = iter->current_element->next;

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    for(i = iter->slot_index;i < h->slots;i++) {
      if(h->table[i]->head) {
        iter->current_element = h->table[i]->head;
        iter->slot_index = i+1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct curl_hash_element *he = iter->current_element->ptr;
    return he;
  }
  else {
    iter->current_element = NULL;
    return NULL;
  }
}